

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool ON_SubDVertex::Internal_GetGeneralQuadSubdivisionPoint
               (ON_SubDVertex *vertex,double *vertex_point)

{
  double dVar1;
  ushort uVar2;
  ON_SubDFace **ppOVar3;
  bool bVar4;
  char *sFormat;
  ulong uVar5;
  ulong uVar6;
  int line_number;
  ON_SubDVertex *pOVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ON_3dPoint sharp_subdivision_point;
  double faceC [3];
  ON_3dPoint local_68;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  dVar9 = ON_DBL_QNAN;
  if (vertex_point == (double *)0x0) {
    ON_SubDIncrementErrorCount();
    sFormat = "input vertex_point is nullptr.";
    line_number = 0x3af4;
  }
  else {
    *vertex_point = ON_DBL_QNAN;
    vertex_point[1] = dVar9;
    vertex_point[2] = dVar9;
    if (vertex == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      sFormat = "input vertex is nullptr.";
      line_number = 0x3afe;
    }
    else {
      if ((vertex->m_faces != (ON_SubDFace **)0x0) && (vertex->m_edges != (ON_SubDEdgePtr *)0x0)) {
        uVar2 = vertex->m_face_count;
        uVar5 = (ulong)uVar2;
        if ((1 < uVar2) && (uVar2 == vertex->m_edge_count)) {
          dVar9 = GetSharpSubdivisionPoint(vertex,&local_68);
          if (1.0 <= dVar9) {
            *vertex_point = local_68.x;
            vertex_point[1] = local_68.y;
          }
          else {
            dVar15 = 0.0;
            dVar16 = 0.0;
            dVar17 = 0.0;
            if (uVar5 != 0) {
              ppOVar3 = vertex->m_faces;
              uVar6 = 0;
              local_50 = dVar9;
              do {
                if ((ppOVar3[uVar6] == (ON_SubDFace *)0x0) ||
                   (bVar4 = ON_SubDFace::GetSubdivisionPoint(ppOVar3[uVar6],&local_48),
                   dVar9 = local_50, dVar10 = local_38, dVar12 = local_40, dVar13 = local_48, !bVar4
                   )) {
                  dVar10 = vertex->m_P[2];
                  dVar12 = vertex->m_P[1];
                  dVar13 = vertex->m_P[0];
                }
                dVar17 = dVar17 + dVar13;
                dVar16 = dVar16 + dVar12;
                dVar15 = dVar15 + dVar10;
                uVar6 = uVar6 + 1;
              } while (uVar5 != uVar6);
            }
            dVar12 = 0.0;
            dVar10 = 0.0;
            dVar13 = 0.0;
            uVar8 = (uint)uVar2;
            if (uVar5 != 0) {
              uVar5 = 0;
              dVar12 = 0.0;
              do {
                uVar6 = vertex->m_edges[uVar5].m_ptr & 0xfffffffffffffff8;
                if (uVar6 == 0) {
LAB_005e5158:
                  dVar1 = vertex->m_P[0];
                  dVar11 = vertex->m_P[1];
                  dVar14 = vertex->m_P[2];
                }
                else {
                  pOVar7 = *(ON_SubDVertex **)(uVar6 + 0x88);
                  if (*(ON_SubDVertex **)(uVar6 + 0x80) == vertex) {
                    if (pOVar7 == vertex) goto LAB_005e5134;
                  }
                  else {
                    bVar4 = pOVar7 != vertex;
                    pOVar7 = *(ON_SubDVertex **)(uVar6 + 0x80);
                    if (bVar4) {
LAB_005e5134:
                      pOVar7 = (ON_SubDVertex *)0x0;
                    }
                  }
                  if (pOVar7 == (ON_SubDVertex *)0x0) goto LAB_005e5158;
                  dVar1 = pOVar7->m_P[0];
                  dVar11 = pOVar7->m_P[1];
                  dVar14 = pOVar7->m_P[2];
                }
                dVar13 = dVar13 + dVar1;
                dVar12 = dVar12 + dVar11;
                dVar10 = dVar10 + dVar14;
                uVar5 = uVar5 + 1;
              } while (uVar8 != uVar5);
            }
            dVar11 = -2.0 / (double)uVar8 + 1.0;
            dVar14 = 1.0 / (double)(uVar8 * uVar8);
            dVar17 = vertex->m_P[0] * dVar11 + (dVar17 + dVar13) * dVar14;
            *vertex_point = dVar17;
            dVar16 = vertex->m_P[1] * dVar11 + (dVar16 + dVar12) * dVar14;
            vertex_point[1] = dVar16;
            dVar15 = dVar11 * vertex->m_P[2] + dVar14 * (dVar15 + dVar10);
            vertex_point[2] = dVar15;
            if (dVar9 <= 0.0) {
              return true;
            }
            dVar10 = 1.0 - dVar9;
            *vertex_point = dVar17 * dVar10 + local_68.x * dVar9;
            vertex_point[1] = dVar16 * dVar10 + local_68.y * dVar9;
            local_68.z = dVar10 * dVar15 + local_68.z * dVar9;
          }
          vertex_point[2] = local_68.z;
          return true;
        }
      }
      ON_SubDIncrementErrorCount();
      sFormat = "input vertex is not valid.";
      line_number = 0x3b09;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
             ,line_number,"",sFormat);
  return false;
}

Assistant:

bool ON_SubDVertex::Internal_GetGeneralQuadSubdivisionPoint(
  const class ON_SubDVertex* vertex,
  double vertex_point[3]
)
{
  if (nullptr == vertex_point)
  {
    ON_SUBD_ERROR("input vertex_point is nullptr.");
    return false;
  }

  vertex_point[0] = ON_DBL_QNAN;
  vertex_point[1] = ON_DBL_QNAN;
  vertex_point[2] = ON_DBL_QNAN;

  if (nullptr == vertex)
  {
    ON_SUBD_ERROR("input vertex is nullptr.");
    return false;
  }

  const unsigned int n = vertex->m_face_count;
  if (nullptr == vertex->m_faces
    || nullptr == vertex->m_edges
    || vertex->m_face_count != vertex->m_edge_count
    || n < ON_SubDSectorType::MinimumSectorFaceCount(ON_SubDVertexTag::Smooth)
    )
  {
    ON_SUBD_ERROR("input vertex is not valid.");
    return false;
  }

  const double* vertexP = vertex->m_P;

  ON_3dPoint sharp_subdivision_point;
  const double vertex_sharpness = vertex->GetSharpSubdivisionPoint(sharp_subdivision_point);
  if (vertex_sharpness >= 1.0)
  {
    vertex_point[0] = sharp_subdivision_point.x;
    vertex_point[1] = sharp_subdivision_point.y;
    vertex_point[2] = sharp_subdivision_point.z;
    return true;
  }

  // It is critical to use the centroids of the neighboring faces
  // in this step because the number of edges in each face's
  // boundary may not be constant.
  double facePsum[3] = {};
  const ON_SubDFace*const* vertex_faces = vertex->m_faces;
  for (unsigned int i = 0; i < n; i++)
  {
    const ON_SubDFace* face = vertex_faces[i];
    if (nullptr != face)
    {
      double faceC[3];
      if (face->GetSubdivisionPoint( faceC))
      {
        facePsum[0] += faceC[0];
        facePsum[1] += faceC[1];
        facePsum[2] += faceC[2];
        continue;
      }
    }
    // treat missing or damaged face as infinitesimally small
    facePsum[0] += vertexP[0];
    facePsum[1] += vertexP[1];
    facePsum[2] += vertexP[2];
  }

  double edgePsum[3] = {};
  class ON_SubDEdgePtr* edges = vertex->m_edges;
  for (unsigned int i = 0; i < n; i++)
  {
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(edges[i].m_ptr);
    if (nullptr != edge)
    {
      const ON_SubDVertex* edge_vertex = edge->OtherEndVertex(vertex);
      if (nullptr != edge_vertex)
      {
        const double* edgeP = edge_vertex->m_P;
        edgePsum[0] += edgeP[0];
        edgePsum[1] += edgeP[1];
        edgePsum[2] += edgeP[2];
        continue;
      }
    }
    // treat missing or damaged edge as infinitesimally small
    edgePsum[0] += vertexP[0];
    edgePsum[1] += vertexP[1];
    edgePsum[2] += vertexP[2];
  }

  const double v_weight = 1.0 - 2.0 / ((double)n);
  const double ef_weight = 1.0 / ((double)(n*n));
  vertex_point[0] = v_weight*vertexP[0] + ef_weight*(edgePsum[0] + facePsum[0]);
  vertex_point[1] = v_weight*vertexP[1] + ef_weight*(edgePsum[1] + facePsum[1]);
  vertex_point[2] = v_weight*vertexP[2] + ef_weight*(edgePsum[2] + facePsum[2]);

  if (vertex_sharpness > 0.0)
  {
    // 0 < vertex_sharpness < 1
    const double a = 1.0 - vertex_sharpness;
    vertex_point[0] = a * vertex_point[0] + vertex_sharpness * sharp_subdivision_point.x;
    vertex_point[1] = a * vertex_point[1] + vertex_sharpness * sharp_subdivision_point.y;
    vertex_point[2] = a * vertex_point[2] + vertex_sharpness * sharp_subdivision_point.z;
    return true;
  }

  return true;
}